

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O1

void pzshape::TPZShapePrism::ShapeCorner
               (TPZVec<double> *pt,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double *pdVar1;
  long lVar2;
  
  pdVar1 = pt->fStore;
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *phi->fElem = (1.0 - pdVar1[2]) * ((1.0 - *pdVar1) - pdVar1[1]) * 0.5;
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  phi->fElem[1] = (1.0 - pt->fStore[2]) * *pt->fStore * 0.5;
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  phi->fElem[2] = (1.0 - pt->fStore[2]) * pt->fStore[1] * 0.5;
  pdVar1 = pt->fStore;
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 4) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  phi->fElem[3] = (pdVar1[2] + 1.0) * ((1.0 - *pdVar1) - pdVar1[1]) * 0.5;
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 5) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  phi->fElem[4] = (pt->fStore[2] + 1.0) * *pt->fStore * 0.5;
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 6) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  phi->fElem[5] = (pt->fStore[2] + 1.0) * pt->fStore[1] * 0.5;
  if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *dphi->fElem = (1.0 - pt->fStore[2]) * -0.5;
  if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  dphi->fElem[1] = (1.0 - pt->fStore[2]) * -0.5;
  if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
     ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  dphi->fElem[2] = ((1.0 - *pt->fStore) - pt->fStore[1]) * -0.5;
  if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  dphi->fElem[lVar2] = (1.0 - pt->fStore[2]) * 0.5;
  if ((lVar2 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  dphi->fElem[lVar2 + 1] = 0.0;
  if ((lVar2 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  dphi->fElem[lVar2 + 2] = *pt->fStore * -0.5;
  if ((lVar2 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  dphi->fElem[lVar2 * 2] = 0.0;
  if ((lVar2 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  dphi->fElem[lVar2 * 2 + 1] = (1.0 - pt->fStore[2]) * 0.5;
  if ((lVar2 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  dphi->fElem[lVar2 * 2 + 2] = pt->fStore[1] * -0.5;
  if ((0 < lVar2) && (3 < (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
    lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    dphi->fElem[lVar2 * 3] = (pt->fStore[2] + 1.0) * -0.5;
    if ((lVar2 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    dphi->fElem[lVar2 * 3 + 1] = (pt->fStore[2] + 1.0) * -0.5;
    if ((lVar2 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    dphi->fElem[lVar2 * 3 + 2] = ((1.0 - *pt->fStore) - pt->fStore[1]) * 0.5;
    if ((lVar2 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 5)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    dphi->fElem[lVar2 * 4] = (pt->fStore[2] + 1.0) * 0.5;
    if ((lVar2 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 5)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    dphi->fElem[lVar2 * 4 + 1] = 0.0;
    if ((lVar2 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 5)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    dphi->fElem[lVar2 * 4 + 2] = *pt->fStore * 0.5;
    if ((lVar2 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 6)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    dphi->fElem[lVar2 * 5] = 0.0;
    if ((lVar2 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 6)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    dphi->fElem[lVar2 * 5 + 1] = (pt->fStore[2] + 1.0) * 0.5;
    if ((2 < lVar2) && (5 < (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
      dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 5 + 2] =
           pt->fStore[1] * 0.5;
      return;
    }
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZShapePrism::ShapeCorner(const TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi) {
        phi(0,0)  = .5*(1.-pt[0]-pt[1])*(1.-pt[2]);
        phi(1,0)  = .5*pt[0]*(1.-pt[2]);
        phi(2,0)  = .5*pt[1]*(1.-pt[2]);
        phi(3,0)  = .5*(1.-pt[0]-pt[1])*(1.+pt[2]);
        phi(4,0)  = .5*pt[0]*(1.+pt[2]);
        phi(5,0)  = .5*pt[1]*(1.+pt[2]);
        
        dphi(0,0) = -.5*(1.-pt[2]);
        dphi(1,0) = -.5*(1.-pt[2]);
        dphi(2,0) = -.5*(1.-pt[0]-pt[1]);
        
        dphi(0,1) =  .5*(1.-pt[2]);
        dphi(1,1) =  .0;
        dphi(2,1) = -.5*pt[0];
        
        dphi(0,2) =  .0;
        dphi(1,2) =  .5*(1.-pt[2]);
        dphi(2,2) = -.5*pt[1];
        
        dphi(0,3) = -.5*(1.+pt[2]);
        dphi(1,3) = -.5*(1.+pt[2]);
        dphi(2,3) =  .5*(1.-pt[0]-pt[1]);
        
        dphi(0,4) =  .5*(1.+pt[2]);
        dphi(1,4) =  .0;
        dphi(2,4) =  .5*pt[0];
        
        dphi(0,5) =  .0;
        dphi(1,5) =  .5*(1.+pt[2]);
        dphi(2,5) =  .5*pt[1];
    }